

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

void __thiscall LiteScript::Memory::GarbageCollector(Memory *this,State *state)

{
  vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_> tmp;
  State **local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  State *local_10;
  
  local_28 = (State **)0x0;
  uStack_20 = 0;
  local_18 = 0;
  local_10 = state;
  std::vector<LiteScript::State_const*,std::allocator<LiteScript::State_const*>>::
  _M_realloc_insert<LiteScript::State_const*>
            ((vector<LiteScript::State_const*,std::allocator<LiteScript::State_const*>> *)&local_28,
             (iterator)0x0,&local_10);
  GarbageCollector(this,1,local_28);
  if (local_28 != (State **)0x0) {
    operator_delete(local_28);
  }
  return;
}

Assistant:

void LiteScript::Memory::GarbageCollector(const State& state) {
    std::vector<const State *> tmp;
    tmp.push_back(&state);
    this->GarbageCollector(1, tmp.data());
}